

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool __thiscall ImGui::NavScoreItem(ImGui *this,ImGuiNavMoveResult *result,ImRect cand)

{
  float *pfVar1;
  ImGuiNavLayer IVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  ulong uVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  uint uVar9;
  ImRect *pIVar10;
  long lVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined4 uVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ImVec2 IVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ImVec2 local_28;
  undefined8 local_18;
  
  pIVar7 = GImGui;
  local_28 = cand.Max;
  auVar13._0_8_ = cand.Min;
  auVar13._8_8_ = cand.Min;
  pIVar4 = GImGui->CurrentWindow;
  IVar2 = GImGui->NavLayer;
  if (IVar2 != (pIVar4->DC).NavLayerCurrent) {
    return false;
  }
  GImGui->NavScoringCount = GImGui->NavScoringCount + 1;
  pIVar5 = pIVar7->NavWindow;
  if (pIVar4->ParentWindow == pIVar5) {
    fVar12 = cand.Min.x;
    fVar17 = cand.Min.y;
    if ((pIVar4->ClipRect).Max.y <= fVar17) {
      return false;
    }
    fVar18 = cand.Max.x;
    fVar22 = cand.Max.y;
    pfVar1 = &(pIVar4->ClipRect).Min.y;
    if (fVar22 < *pfVar1 || fVar22 == *pfVar1) {
      return false;
    }
    if ((pIVar4->ClipRect).Max.x <= fVar12) {
      return false;
    }
    if (fVar18 < (pIVar4->ClipRect).Min.x || fVar18 == (pIVar4->ClipRect).Min.x) {
      return false;
    }
    IVar21 = (pIVar4->ClipRect).Max;
    fVar23 = (pIVar4->ClipRect).Min.y;
    fVar20 = (pIVar4->ClipRect).Min.x;
    fVar19 = IVar21.x;
    fVar25 = fVar23;
    fVar26 = 0.0;
    if ((fVar23 <= fVar17) && (fVar25 = IVar21.y, fVar26 = IVar21.y, fVar17 <= IVar21.y)) {
      fVar25 = fVar17;
    }
    fVar24 = fVar19;
    if (fVar12 <= fVar19) {
      fVar24 = fVar12;
    }
    auVar14._4_4_ = ~(uint)fVar17 & (uint)IVar21.y;
    auVar14._0_4_ = ~-(uint)(fVar12 < fVar20) & (uint)fVar24;
    auVar14._8_8_ = 0;
    auVar14 = ZEXT416(-(uint)(fVar12 < fVar20) & (uint)fVar20) | auVar14;
    if ((fVar23 <= fVar22) && (fVar23 = IVar21.y, fVar22 <= IVar21.y)) {
      fVar23 = fVar22;
    }
    auVar15._0_8_ = auVar14._0_8_;
    auVar15._8_4_ = auVar14._4_4_;
    auVar15._12_4_ = fVar26;
    auVar13._8_8_ = auVar15._8_8_;
    auVar13._0_4_ = auVar14._0_4_;
    auVar13._4_4_ = fVar25;
    if (fVar18 <= fVar19) {
      IVar21.x = fVar18;
    }
    local_28.y = fVar23;
    local_28.x = (float)(-(uint)(fVar18 < fVar20) & (uint)fVar20 |
                        ~-(uint)(fVar18 < fVar20) & (uint)IVar21.x);
  }
  local_18 = auVar13._0_8_;
  bVar8 = 1 < (uint)pIVar7->NavMoveClipDir;
  uVar16 = auVar13._4_4_;
  if (bVar8) {
    pIVar10 = &pIVar4->ClipRect;
    lVar11 = 0x260;
  }
  else {
    auVar13._4_4_ = uVar16;
    auVar13._0_4_ = uVar16;
    auVar13._8_4_ = uVar16;
    auVar13._12_4_ = uVar16;
    pIVar10 = (ImRect *)&(pIVar4->ClipRect).Min.y;
    lVar11 = 0x264;
  }
  bVar8 = !bVar8;
  fVar12 = (pIVar10->Min).x;
  fVar17 = *(float *)((long)&pIVar4->Name + lVar11);
  fVar22 = auVar13._0_4_;
  fVar18 = fVar17;
  if (fVar22 <= fVar17) {
    fVar18 = fVar22;
  }
  uVar6 = (ulong)bVar8;
  *(uint *)((long)&local_18 + uVar6 * 4) =
       -(uint)(fVar22 < fVar12) & (uint)fVar12 | ~-(uint)(fVar22 < fVar12) & (uint)fVar18;
  fVar18 = (&local_28.x)[bVar8];
  if (fVar18 <= fVar17) {
    fVar17 = fVar18;
  }
  (&local_28.x)[uVar6] =
       (float)(-(uint)(fVar18 < fVar12) & (uint)fVar12 | ~-(uint)(fVar18 < fVar12) & (uint)fVar17);
  fVar12 = (pIVar7->NavScoringRect).Min.x;
  fVar17 = (pIVar7->NavScoringRect).Max.x;
  if (fVar12 <= local_28.x) {
    fVar18 = 0.0;
    if (fVar17 < (float)local_18) {
      fVar18 = (float)local_18 - fVar17;
    }
  }
  else {
    fVar18 = local_28.x - fVar12;
  }
  fVar20 = (local_28.y - local_18._4_4_) * 0.8 + local_18._4_4_;
  fVar22 = (pIVar7->NavScoringRect).Min.y;
  fVar23 = (pIVar7->NavScoringRect).Max.y;
  fVar25 = fVar23 - fVar22;
  fVar26 = fVar25 * 0.2 + fVar22;
  if (fVar26 <= fVar20) {
    fVar26 = (local_28.y - local_18._4_4_) * 0.2 + local_18._4_4_;
    fVar25 = fVar25 * 0.8 + fVar22;
    fVar20 = 0.0;
    if (fVar25 < fVar26) {
      fVar20 = fVar26 - fVar25;
    }
  }
  else {
    fVar20 = fVar20 - fVar26;
  }
  if (((fVar18 != 0.0) || (NAN(fVar18))) && ((fVar20 != 0.0 || (NAN(fVar20))))) {
    fVar18 = fVar18 / 1000.0 + *(float *)(&DAT_0018c3c4 + (ulong)(0.0 < fVar18) * 4);
  }
  fVar12 = (local_28.x + (float)local_18) - (fVar12 + fVar17);
  fVar17 = (local_28.y + local_18._4_4_) - (fVar22 + fVar23);
  fVar22 = ABS(fVar20) + ABS(fVar18);
  fVar23 = ABS(fVar12) + ABS(fVar17);
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
LAB_0013587f:
    fVar25 = fVar22;
    uVar9 = (uint)(0.0 < fVar18);
    fVar12 = fVar18;
    fVar17 = fVar20;
    if (ABS(fVar18) <= ABS(fVar20)) {
      uVar9 = 0.0 < fVar20 | 2;
    }
  }
  else {
    if ((fVar18 != 0.0) || (NAN(fVar18))) goto LAB_0013587f;
    if ((((fVar12 != 0.0) || (NAN(fVar12))) || (fVar17 != 0.0)) || (NAN(fVar17))) {
      fVar25 = fVar23;
      uVar9 = 0.0 < fVar17 | 2;
      if (ABS(fVar17) < ABS(fVar12)) {
        uVar9 = (uint)(0.0 < fVar12);
      }
    }
    else {
      fVar25 = 0.0;
      uVar9 = (uint)(pIVar7->NavId <= (pIVar4->DC).LastItemId);
      fVar12 = 0.0;
      fVar17 = 0.0;
    }
  }
  uVar3 = pIVar7->NavMoveDir;
  if (uVar9 == uVar3) {
    fVar26 = *(float *)(this + 0x10);
    if (fVar22 < fVar26) {
      *(ulong *)(this + 0x10) = CONCAT44(fVar23,fVar22);
      return true;
    }
    if ((fVar22 == fVar26) && (!NAN(fVar22) && !NAN(fVar26))) {
      fVar22 = *(float *)(this + 0x14);
      if (fVar23 < fVar22) {
        *(float *)(this + 0x14) = fVar23;
LAB_00135930:
        bVar8 = true;
        goto LAB_00135936;
      }
      if ((fVar23 == fVar22) && (!NAN(fVar23) && !NAN(fVar22))) {
        if ((uVar3 & 0xfffffffe) != 2) {
          fVar20 = fVar18;
        }
        if (fVar20 < 0.0) goto LAB_00135930;
      }
    }
  }
  bVar8 = false;
LAB_00135936:
  if (*(float *)(this + 0x10) != 3.4028235e+38) {
    return bVar8;
  }
  if (NAN(*(float *)(this + 0x10))) {
    return bVar8;
  }
  if (IVar2 != ImGuiNavLayer_Menu) {
    return bVar8;
  }
  if (fVar25 < *(float *)(this + 0x18)) {
    if ((pIVar5->Flags & 0x10000000) != 0) {
      return bVar8;
    }
    if ((((uVar3 != 0) || (0.0 <= fVar12)) && ((uVar3 != 1 || (fVar12 <= 0.0)))) &&
       ((uVar3 != 2 || (0.0 <= fVar17)))) {
      if (uVar3 != 3) {
        return bVar8;
      }
      if (fVar17 <= 0.0) {
        return bVar8;
      }
    }
    *(float *)(this + 0x18) = fVar25;
    return true;
  }
  return bVar8;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavMoveResult* result, ImRect cand)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    const ImRect& curr = g.NavScoringRect; // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
        dbx = (dbx / 1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (window->DC.LastItemId < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4, 4), cand.Max + CalcTextSize(buf) + ImVec2(4, 4), IM_COL32(40,0,0,150));
        draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (IsKeyPressedMap(ImGuiKey_C)) { g.NavMoveDirLast = (ImGuiDir)((g.NavMoveDirLast + 1) & 3); g.IO.KeysDownDuration[g.IO.KeyMap[ImGuiKey_C]] = 0.01f; }
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
#endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    if (quadrant == g.NavMoveDir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((g.NavMoveDir == ImGuiDir_Up || g.NavMoveDir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == ImGuiNavLayer_Menu && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((g.NavMoveDir == ImGuiDir_Left && dax < 0.0f) || (g.NavMoveDir == ImGuiDir_Right && dax > 0.0f) || (g.NavMoveDir == ImGuiDir_Up && day < 0.0f) || (g.NavMoveDir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}